

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::ConfigureSubDirectory(cmMakefile *this,cmMakefile *mf)

{
  bool bVar1;
  PolicyStatus PVar2;
  char *pcVar3;
  ostream *poVar4;
  PolicyID id;
  PolicyID id_00;
  string local_1d0;
  string currentStart;
  string msg;
  
  InitializeFromParent(mf,this);
  pcVar3 = cmState::Snapshot::GetCurrentSourceDirectory(&mf->StateSnapshot);
  std::__cxx11::string::string((string *)&currentStart,pcVar3,(allocator *)&msg);
  if (this->LocalGenerator->GlobalGenerator->CMakeInstance->DebugOutput == true) {
    std::__cxx11::string::string((string *)&msg,"   Entering             ",(allocator *)&local_1d0);
    std::__cxx11::string::append((string *)&msg);
    cmSystemTools::Message(msg._M_dataplus._M_p,(char *)0x0);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::__cxx11::string::append((char *)&currentStart);
  bVar1 = cmsys::SystemTools::FileExists(currentStart._M_dataplus._M_p,true);
  if (bVar1) {
    Configure(mf);
    if (this->LocalGenerator->GlobalGenerator->CMakeInstance->DebugOutput == true) {
      std::__cxx11::string::string
                ((string *)&msg,"   Returning to         ",(allocator *)&local_1d0);
      cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
      std::__cxx11::string::append((char *)&msg);
      cmSystemTools::Message(msg._M_dataplus._M_p,(char *)0x0);
      std::__cxx11::string::~string((string *)&msg);
    }
    goto LAB_00293e78;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar4 = std::operator<<((ostream *)&msg,"The source directory\n");
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = std::operator<<(poVar4,(string *)&currentStart);
  poVar4 = std::operator<<(poVar4,"\n");
  std::operator<<(poVar4,"does not contain a CMakeLists.txt file.");
  PVar2 = GetPolicyStatus(this,CMP0014);
  if (PVar2 - REQUIRED_IF_USED < 2) {
    poVar4 = std::operator<<((ostream *)&msg,"\n");
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1d0,(cmPolicies *)0xe,id);
    std::operator<<(poVar4,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
LAB_00293da6:
    std::__cxx11::stringbuf::str();
    IssueMessage(this,FATAL_ERROR,&local_1d0);
LAB_00293e5c:
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  else {
    if (PVar2 == WARN) {
      poVar4 = std::operator<<((ostream *)&msg,"\n");
      poVar4 = std::operator<<(poVar4,"CMake does not support this case but it used ");
      poVar4 = std::operator<<(poVar4,"to work accidentally and is being allowed for ");
      poVar4 = std::operator<<(poVar4,"compatibility.");
      poVar4 = std::operator<<(poVar4,"\n");
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d0,(cmPolicies *)0xe,id_00);
      std::operator<<(poVar4,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&local_1d0);
      goto LAB_00293e5c;
    }
    if (PVar2 == NEW) goto LAB_00293da6;
  }
  mf->Configured = true;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
LAB_00293e78:
  std::__cxx11::string::~string((string *)&currentStart);
  return;
}

Assistant:

void cmMakefile::ConfigureSubDirectory(cmMakefile *mf)
{
  mf->InitializeFromParent(this);
  std::string currentStart = mf->GetCurrentSourceDirectory();
  if (this->GetCMakeInstance()->GetDebugOutput())
    {
    std::string msg="   Entering             ";
    msg += currentStart;
    cmSystemTools::Message(msg.c_str());
    }

  currentStart += "/CMakeLists.txt";
  if(!cmSystemTools::FileExists(currentStart.c_str(), true))
    {
    // The file is missing.  Check policy CMP0014.
    std::ostringstream e;
    e << "The source directory\n"
      << "  " << currentStart << "\n"
      << "does not contain a CMakeLists.txt file.";
    switch (this->GetPolicyStatus(cmPolicies::CMP0014))
      {
      case cmPolicies::WARN:
        // Print the warning.
        e << "\n"
          << "CMake does not support this case but it used "
          << "to work accidentally and is being allowed for "
          << "compatibility."
          << "\n"
          << cmPolicies::GetPolicyWarning(cmPolicies::CMP0014);
        this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << "\n"
          << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0014);
      case cmPolicies::NEW:
        // NEW behavior prints the error.
        this->IssueMessage(cmake::FATAL_ERROR, e.str());
      }
    mf->SetConfigured();
    return;
    }
  // finally configure the subdir
  mf->Configure();

  if (this->GetCMakeInstance()->GetDebugOutput())
    {
    std::string msg="   Returning to         ";
    msg += this->GetCurrentSourceDirectory();
    cmSystemTools::Message(msg.c_str());
    }
}